

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O2

void __thiscall
flatbuffers::dart::DartGenerator::GenStruct
          (DartGenerator *this,StructDef *struct_def,namespace_code_map *namespace_code)

{
  IdlNamer *pIVar1;
  string *psVar2;
  mapped_type *code;
  pointer ppFVar3;
  pointer ppFVar4;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  non_deprecated_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> builder_name;
  string builder_code;
  string reader_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> reader_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> object_builder_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  key_type local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  IdlNamer *local_140;
  string *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((struct_def->super_Definition).generated == false) {
    pIVar1 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[10])
              (&local_188,pIVar1,(struct_def->super_Definition).defined_namespace);
    code = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](namespace_code,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_188,pIVar1,struct_def);
    GenDocComment(&(struct_def->super_Definition).doc_comment,"",code);
    std::operator+(&local_110,"_",&local_188);
    std::operator+(&local_b0,&local_110,"Reader");
    std::__cxx11::string::~string((string *)&local_110);
    std::operator+(&local_110,&local_188,"Builder");
    std::operator+(&local_50,&local_188,"ObjectBuilder");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_1a8,"class ",&local_188);
    std::operator+(&local_1c8,&local_1a8," {\n");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::operator+(&local_1a8,"  ",&local_188);
    std::operator+(&local_1c8,&local_1a8,"._(this._bc, this._bcOffset);\n");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if (struct_def->fixed == false) {
      std::operator+(&local_1a8,"  factory ",&local_188);
      std::operator+(&local_1c8,&local_1a8,"(List<int> bytes) {\n");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::operator+(&local_1a8,"    final rootRef = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _kFb_abi_cxx11_);
      std::operator+(&local_1c8,&local_1a8,".BufferContext.fromBytes(bytes);\n");
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::append((char *)code);
      std::__cxx11::string::append((char *)code);
    }
    std::__cxx11::string::append((char *)code);
    std::operator+(&local_90,"  static const ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _kFb_abi_cxx11_);
    std::operator+(&local_70,&local_90,".Reader<");
    std::operator+(&local_168,&local_70,&local_188);
    std::operator+(&local_130,&local_168,"> reader = ");
    std::operator+(&local_1a8,&local_130,&local_b0);
    std::operator+(&local_1c8,&local_1a8,"();\n\n");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::operator+(&local_1a8,"  final ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _kFb_abi_cxx11_);
    std::operator+(&local_1c8,&local_1a8,".BufferContext _bc;\n");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::append((char *)code);
    local_168.field_2._M_allocated_capacity = 0;
    local_168._M_dataplus._M_p = (pointer)0x0;
    local_168._M_string_length = 0;
    ppFVar3 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = ppFVar3;
    local_140 = pIVar1;
    local_138 = code;
    for (; psVar2 = local_138,
        ppFVar3 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
      if ((*ppFVar3)->deprecated == false) {
        local_1c8._M_dataplus._M_p._0_4_ =
             (undefined4)
             ((ulong)((long)ppFVar4 -
                     (long)(struct_def->fields).vec.
                           super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
        local_1c8._M_string_length = (size_type)*ppFVar3;
        std::
        vector<std::pair<int,flatbuffers::FieldDef*>,std::allocator<std::pair<int,flatbuffers::FieldDef*>>>
        ::emplace_back<std::pair<int,flatbuffers::FieldDef*>>
                  ((vector<std::pair<int,flatbuffers::FieldDef*>,std::allocator<std::pair<int,flatbuffers::FieldDef*>>>
                    *)&local_168,(pair<int,_flatbuffers::FieldDef_*> *)&local_1c8);
      }
      ppFVar4 = ppFVar4 + 1;
    }
    GenImplementationGetters
              (this,struct_def,
               (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                *)&local_168,local_138);
    if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
      GenStructObjectAPIUnpack_abi_cxx11_
                (&local_1a8,this,struct_def,
                 (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  *)&local_168);
      std::operator+(&local_1c8,"\n",&local_1a8);
      pIVar1 = local_140;
      std::__cxx11::string::append((string *)psVar2);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1a8);
      (*(pIVar1->super_Namer)._vptr_Namer[0x11])(&local_130,pIVar1,struct_def);
      std::operator+(&local_1a8,"\n  static int pack(fb.Builder fbBuilder, ",&local_130);
      std::operator+(&local_1c8,&local_1a8,"? object) {\n");
      std::__cxx11::string::append((string *)psVar2);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
      std::__cxx11::string::append((char *)psVar2);
    }
    std::__cxx11::string::append((char *)psVar2);
    if ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api == true) {
      GenStructObjectAPI_abi_cxx11_
                (&local_1c8,this,struct_def,
                 (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  *)&local_168);
      std::__cxx11::string::append((string *)psVar2);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    GenReader(this,struct_def,&local_b0,&local_d0);
    GenBuilder(this,struct_def,
               (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                *)&local_168,&local_110,&local_f0);
    GenObjectBuilder(this,struct_def,
                     (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                      *)&local_168,&local_50,&local_f0);
    std::__cxx11::string::append((string *)psVar2);
    std::__cxx11::string::append((string *)psVar2);
    std::
    _Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
    ::~_Vector_base((_Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                     *)&local_168);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_188);
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def,
                 namespace_code_map &namespace_code) {
    if (struct_def.generated) return;

    std::string &code =
        namespace_code[namer_.Namespace(*struct_def.defined_namespace)];

    const auto &struct_type = namer_.Type(struct_def);

    // Emit constructor

    GenDocComment(struct_def.doc_comment, "", code);

    auto reader_name = "_" + struct_type + "Reader";
    auto builder_name = struct_type + "Builder";
    auto object_builder_name = struct_type + "ObjectBuilder";

    std::string reader_code, builder_code;

    code += "class " + struct_type + " {\n";

    code += "  " + struct_type + "._(this._bc, this._bcOffset);\n";
    if (!struct_def.fixed) {
      code += "  factory " + struct_type + "(List<int> bytes) {\n";
      code +=
          "    final rootRef = " + _kFb + ".BufferContext.fromBytes(bytes);\n";
      code += "    return reader.read(rootRef, 0);\n";
      code += "  }\n";
    }

    code += "\n";
    code += "  static const " + _kFb + ".Reader<" + struct_type +
            "> reader = " + reader_name + "();\n\n";

    code += "  final " + _kFb + ".BufferContext _bc;\n";
    code += "  final int _bcOffset;\n\n";

    std::vector<std::pair<int, FieldDef *>> non_deprecated_fields;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      FieldDef &field = **it;
      if (field.deprecated) continue;
      auto offset = static_cast<int>(it - struct_def.fields.vec.begin());
      non_deprecated_fields.push_back(std::make_pair(offset, &field));
    }

    GenImplementationGetters(struct_def, non_deprecated_fields, code);

    if (parser_.opts.generate_object_based_api) {
      code +=
          "\n" + GenStructObjectAPIUnpack(struct_def, non_deprecated_fields);

      code += "\n  static int pack(fb.Builder fbBuilder, " +
              namer_.ObjectType(struct_def) + "? object) {\n";
      code += "    if (object == null) return 0;\n";
      code += "    return object.pack(fbBuilder);\n";
      code += "  }\n";
    }

    code += "}\n\n";

    if (parser_.opts.generate_object_based_api) {
      code += GenStructObjectAPI(struct_def, non_deprecated_fields);
    }

    GenReader(struct_def, reader_name, reader_code);
    GenBuilder(struct_def, non_deprecated_fields, builder_name, builder_code);
    GenObjectBuilder(struct_def, non_deprecated_fields, object_builder_name,
                     builder_code);

    code += reader_code;
    code += builder_code;
  }